

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O3

mbedtls_cipher_info_t * mbedtls_cipher_info_from_type(mbedtls_cipher_type_t cipher_type)

{
  mbedtls_cipher_definition_t *pmVar1;
  mbedtls_cipher_info_t *pmVar2;
  mbedtls_cipher_info_t **ppmVar3;
  
  pmVar2 = &aes_128_ecb_info;
  if (cipher_type != MBEDTLS_CIPHER_AES_128_ECB) {
    ppmVar3 = &mbedtls_cipher_definitions[1].info;
    do {
      pmVar2 = *ppmVar3;
      if (pmVar2 == (mbedtls_cipher_info_t *)0x0) {
        return (mbedtls_cipher_info_t *)0x0;
      }
      pmVar1 = (mbedtls_cipher_definition_t *)(ppmVar3 + -1);
      ppmVar3 = ppmVar3 + 2;
    } while (pmVar1->type != cipher_type);
  }
  return pmVar2;
}

Assistant:

const mbedtls_cipher_info_t *mbedtls_cipher_info_from_type( const mbedtls_cipher_type_t cipher_type )
{
    const mbedtls_cipher_definition_t *def;

    for( def = mbedtls_cipher_definitions; def->info != NULL; def++ )
        if( def->type == cipher_type )
            return( def->info );

    return( NULL );
}